

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O1

bool bidfx_public_api::price::Currencies::IsValidCurrencyPair(string *ccy_pair)

{
  byte extraout_AL;
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  string local_48;
  
  if (ccy_pair->_M_string_length == 6) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)ccy_pair);
    iVar2 = Precedence(&local_48);
    bVar1 = (byte)iVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      bVar1 = extraout_AL;
    }
    if (iVar2 == -1) {
      bVar4 = true;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)ccy_pair);
      iVar3 = Precedence(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar4 = iVar3 == -1;
      bVar1 = iVar2 < iVar3;
    }
    if (!bVar4) goto LAB_001a4b51;
  }
  bVar1 = 0;
LAB_001a4b51:
  return (bool)(bVar1 & 1);
}

Assistant:

bool Currencies::IsValidCurrencyPair(const std::string& ccy_pair)
{
    if (!ccy_pair.empty())
    {
        if (ccy_pair.length() == 6)
        {
            int precedence1 = Precedence(ccy_pair.substr(0, 3));

            if (precedence1 != -1)
            {
                int precedence2 = Precedence(ccy_pair.substr(3, 6));

                if (precedence2 != -1)
                {
                    return precedence1 < precedence2;
                }
            }
        }
    }

    return false;
}